

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_NtkRunEco(char **pFileNames,int fCheck,int fRandom,int fInputs,int fVerbose,
                  int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  Acb_Ntk_t *p;
  Acb_Ntk_t *p_00;
  Vec_Ptr_t *pVVar3;
  Abc_Frame_t *pAbc;
  char *local_450;
  Acb_Ntk_t *pNtkG;
  Acb_Ntk_t *pNtkF;
  char local_418 [4];
  int Result;
  char Command [1000];
  int fVeryVerbose_local;
  int fVerbose_local;
  int fInputs_local;
  int fRandom_local;
  int fCheck_local;
  char **pFileNames_local;
  
  p = Acb_VerilogSimpleRead(*pFileNames,pFileNames[2]);
  p_00 = Acb_VerilogSimpleRead(pFileNames[1],(char *)0x0);
  if ((p != (Acb_Ntk_t *)0x0) && (p_00 != (Acb_Ntk_t *)0x0)) {
    if (fRandom != 0) {
      printf("Permuting targets as follows:   ");
      Vec_IntPermute(&p->vTargets);
      Vec_IntPrint(&p->vTargets);
    }
    iVar1 = Acb_NtkCiNum(p);
    iVar2 = Acb_NtkCiNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0xb1e,"void Acb_NtkRunEco(char **, int, int, int, int, int)");
    }
    iVar1 = Acb_NtkCoNum(p);
    iVar2 = Acb_NtkCoNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0xb1f,"void Acb_NtkRunEco(char **, int, int, int, int, int)");
    }
    pVVar3 = Abc_FrameReadSignalNames();
    Acb_IntallLibrary((uint)(pVVar3 != (Vec_Ptr_t *)0x0));
    iVar1 = Acb_NtkEcoPerform(p,p_00,pFileNames,0,fInputs,fCheck,fVerbose,fVeryVerbose);
    if (iVar1 == 0) {
      printf("Computation did not succeed.\n");
    }
    Acb_ManFree(p->pDesign);
    Acb_ManFree(p_00->pDesign);
    if (pFileNames[3] == (char *)0x0) {
      local_450 = "out.v";
    }
    else {
      local_450 = pFileNames[3];
    }
    sprintf(local_418,
            "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig"
            ,pFileNames[1],local_450);
    if (iVar1 != 0) {
      pAbc = Abc_FrameGetGlobalFrame();
      iVar1 = Cmd_CommandExecute(pAbc,local_418);
      if (iVar1 != 0) {
        fprintf(_stdout,"Cannot execute command \"%s\".\n",local_418);
      }
    }
    printf("\n");
  }
  return;
}

Assistant:

void Acb_NtkRunEco( char * pFileNames[4], int fCheck, int fRandom, int fInputs, int fVerbose, int fVeryVerbose )
{
    char Command[1000]; int Result = 1;
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileNames[0], pFileNames[2] );
    Acb_Ntk_t * pNtkG = Acb_VerilogSimpleRead( pFileNames[1], NULL );
    if ( !pNtkF || !pNtkG )
        return;
    //int * pArray = Vec_IntArray( &pNtkF->vTargets );
    //ABC_SWAP( int, pArray[7], pArray[4] );
    //Vec_IntReverseOrder( &pNtkF->vTargets );
    if ( fRandom )
    {
        printf( "Permuting targets as follows:   " );
        Vec_IntPermute( &pNtkF->vTargets );
        Vec_IntPrint( &pNtkF->vTargets );
    }
        
    assert( Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG) );
    assert( Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG) );

    Acb_IntallLibrary( Abc_FrameReadSignalNames() != NULL );

    if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 0, fInputs, fCheck, fVerbose, fVeryVerbose ) )
    {
//        printf( "General computation timed out. Trying inputs only.\n\n" );
//        if ( !Acb_NtkEcoPerform( pNtkF, pNtkG, pFileNames, 1, fInputs, fCheck, fVerbose, fVeryVerbose ) )
//            printf( "Input-only computation also timed out.\n\n" );
        printf( "Computation did not succeed.\n" );
        Result = 0;
    }

    Acb_ManFree( pNtkF->pDesign );
    Acb_ManFree( pNtkG->pDesign );

    // verify the result
    sprintf( Command, "read %s; strash; write temp1.aig; read %s; strash; write temp2.aig; &cec temp1.aig temp2.aig", 
        pFileNames[1], pFileNames[3] ? pFileNames[3] : "out.v" );
    if ( Result && Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command ) )
        fprintf( stdout, "Cannot execute command \"%s\".\n", Command );
    printf( "\n" );
}